

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectGenericLoop<duckdb::interval_t,duckdb::interval_t,duckdb::NotEquals,false,true,true>
                (interval_t *ldata,interval_t *rdata,SelectionVector *lsel,SelectionVector *rsel,
                SelectionVector *result_sel,idx_t count,ValidityMask *lvalidity,
                ValidityMask *rvalidity,SelectionVector *true_sel,SelectionVector *false_sel)

{
  sel_t *psVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  unsigned_long *puVar4;
  unsigned_long *puVar5;
  ulong uVar6;
  idx_t iVar7;
  ulong uVar8;
  SelectionVector *pSVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  idx_t local_78;
  idx_t local_70;
  
  if (count == 0) {
    local_78 = 0;
  }
  else {
    psVar1 = result_sel->sel_vector;
    psVar2 = lsel->sel_vector;
    psVar3 = rsel->sel_vector;
    puVar4 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    puVar5 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    local_78 = 0;
    local_70 = 0;
    uVar11 = 0;
    do {
      uVar10 = uVar11;
      if (psVar1 != (sel_t *)0x0) {
        uVar10 = (ulong)psVar1[uVar11];
      }
      uVar6 = uVar11;
      if (psVar2 != (sel_t *)0x0) {
        uVar6 = (ulong)psVar2[uVar11];
      }
      uVar8 = uVar11;
      if (psVar3 != (sel_t *)0x0) {
        uVar8 = (ulong)psVar3[uVar11];
      }
      if (((puVar4 == (unsigned_long *)0x0) || ((puVar4[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) != 0)) &&
         ((puVar5 == (unsigned_long *)0x0 || ((puVar5[uVar8 >> 6] >> (uVar8 & 0x3f) & 1) != 0)))) {
        if (((ldata[uVar6].months == rdata[uVar8].months) &&
            (ldata[uVar6].days == rdata[uVar8].days)) &&
           (ldata[uVar6].micros == rdata[uVar8].micros)) goto LAB_0149e691;
        lVar12 = (long)ldata[uVar6].days + ldata[uVar6].micros / 86400000000;
        lVar13 = (long)rdata[uVar8].days + rdata[uVar8].micros / 86400000000;
        if ((((long)ldata[uVar6].months + lVar12 / 0x1e == (long)rdata[uVar8].months + lVar13 / 0x1e
             ) && (lVar12 % 0x1e == lVar13 % 0x1e)) &&
           (ldata[uVar6].micros % 86400000000 == rdata[uVar8].micros % 86400000000))
        goto LAB_0149e691;
        iVar7 = local_78;
        pSVar9 = true_sel;
        local_78 = local_78 + 1;
      }
      else {
LAB_0149e691:
        iVar7 = local_70;
        pSVar9 = false_sel;
        local_70 = local_70 + 1;
      }
      pSVar9->sel_vector[iVar7] = (sel_t)uVar10;
      uVar11 = uVar11 + 1;
    } while (count != uVar11);
  }
  return local_78;
}

Assistant:

static inline idx_t
	SelectGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                  const SelectionVector *__restrict lsel, const SelectionVector *__restrict rsel,
	                  const SelectionVector *__restrict result_sel, idx_t count, ValidityMask &lvalidity,
	                  ValidityMask &rvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
#ifdef DUCKDB_SMALLER_BINARY
		const bool HAS_TRUE_SEL = true_sel;
		const bool HAS_FALSE_SEL = false_sel;
		const bool NO_NULL = false;
#endif
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto lindex = lsel->get_index(i);
			auto rindex = rsel->get_index(i);
			if ((NO_NULL || (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex))) &&
			    OP::Operation(ldata[lindex], rdata[rindex])) {
				if (HAS_TRUE_SEL) {
					true_sel->set_index(true_count++, result_idx);
				}
			} else {
				if (HAS_FALSE_SEL) {
					false_sel->set_index(false_count++, result_idx);
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}